

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

bool __thiscall QUrl::matches(QUrl *this,QUrl *url,FormattingOptions options)

{
  bool bVar1;
  byte bVar2;
  undefined4 in_EDX;
  long *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  FormattingOptions in_stack_0000003c;
  int mask;
  QString path2;
  QString path1;
  QString *in_stack_ffffffffffffff58;
  QUrlPrivate *in_stack_ffffffffffffff60;
  bool local_4d;
  undefined4 in_stack_ffffffffffffffb4;
  Section appendingTo;
  QString *in_stack_ffffffffffffffb8;
  QString *appendTo;
  QUrlPrivate *in_stack_ffffffffffffffc0;
  QUrlPrivate *this_00;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_c;
  long local_8;
  
  local_c.i._3_1_ = (Section)((uint)in_EDX >> 0x18);
  appendingTo = (Section)((uint)in_stack_ffffffffffffffb4 >> 0x18);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == 0) && (*in_RSI == 0)) {
    local_4d = true;
  }
  else if (*in_RDI == 0) {
    local_4d = QUrlPrivate::isEmpty(in_stack_ffffffffffffff60);
  }
  else if (*in_RSI == 0) {
    local_4d = QUrlPrivate::isEmpty(in_stack_ffffffffffffff60);
  }
  else {
    bVar2 = 0xff;
    bVar1 = isLocalFile((QUrl *)in_stack_ffffffffffffff60);
    if (bVar1) {
      bVar2 = 0xf7;
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemoveScheme);
    if (bVar1) {
      bVar2 = bVar2 & 0xfe;
    }
    else {
      bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4d = false;
        goto LAB_002ff6fd;
      }
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemovePassword);
    if (bVar1) {
      bVar2 = bVar2 & 0xfb;
    }
    else {
      bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4d = false;
        goto LAB_002ff6fd;
      }
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemoveUserInfo);
    if (bVar1) {
      bVar2 = bVar2 & 0xfd;
    }
    else {
      bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4d = false;
        goto LAB_002ff6fd;
      }
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemovePort);
    if (bVar1) {
      bVar2 = bVar2 & 0xef;
    }
    else if (*(int *)(*in_RDI + 4) != *(int *)(*in_RSI + 4)) {
      local_4d = false;
      goto LAB_002ff6fd;
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemoveAuthority);
    if (bVar1) {
      bVar2 = bVar2 & 0xf7;
    }
    else {
      bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4d = false;
        goto LAB_002ff6fd;
      }
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemoveQuery);
    if (bVar1) {
      bVar2 = bVar2 & 0xbf;
    }
    else {
      bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4d = false;
        goto LAB_002ff6fd;
      }
    }
    bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_c,RemoveFragment);
    if (bVar1) {
      bVar2 = bVar2 & 0x7f;
    }
    else {
      bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        local_4d = false;
        goto LAB_002ff6fd;
      }
    }
    if ((*(byte *)(*in_RDI + 0xb8) & bVar2) == (*(byte *)(*in_RSI + 0xb8) & bVar2)) {
      bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                        (&local_c,RemovePath);
      if (bVar1) {
        local_4d = true;
      }
      else {
        QString::QString((QString *)0x2ff613);
        QUrlPrivate::appendPath
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_0000003c,appendingTo
                  );
        appendTo = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        this_00 = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x2ff665);
        QUrlPrivate::appendPath(this_00,appendTo,in_stack_0000003c,local_c.i._3_1_);
        local_4d = ::operator==((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        QString::~QString((QString *)0x2ff6af);
        QString::~QString((QString *)0x2ff6bc);
      }
    }
    else {
      local_4d = false;
    }
  }
LAB_002ff6fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4d;
}

Assistant:

bool QUrl::matches(const QUrl &url, FormattingOptions options) const
{
    if (!d && !url.d)
        return true;
    if (!d)
        return url.d->isEmpty();
    if (!url.d)
        return d->isEmpty();

    // First, compare which sections are present, since it speeds up the
    // processing considerably. We just have to ignore the host-is-present flag
    // for local files (the "file" protocol), due to the requirements of the
    // XDG file URI specification.
    int mask = QUrlPrivate::FullUrl;
    if (isLocalFile())
        mask &= ~QUrlPrivate::Host;

    if (options.testFlag(QUrl::RemoveScheme))
        mask &= ~QUrlPrivate::Scheme;
    else if (d->scheme != url.d->scheme)
        return false;

    if (options.testFlag(QUrl::RemovePassword))
        mask &= ~QUrlPrivate::Password;
    else if (d->password != url.d->password)
        return false;

    if (options.testFlag(QUrl::RemoveUserInfo))
        mask &= ~QUrlPrivate::UserName;
    else if (d->userName != url.d->userName)
        return false;

    if (options.testFlag(QUrl::RemovePort))
        mask &= ~QUrlPrivate::Port;
    else if (d->port != url.d->port)
        return false;

    if (options.testFlag(QUrl::RemoveAuthority))
        mask &= ~QUrlPrivate::Host;
    else if (d->host != url.d->host)
        return false;

    if (options.testFlag(QUrl::RemoveQuery))
        mask &= ~QUrlPrivate::Query;
    else if (d->query != url.d->query)
        return false;

    if (options.testFlag(QUrl::RemoveFragment))
        mask &= ~QUrlPrivate::Fragment;
    else if (d->fragment != url.d->fragment)
        return false;

    if ((d->sectionIsPresent & mask) != (url.d->sectionIsPresent & mask))
        return false;

    if (options.testFlag(QUrl::RemovePath))
        return true;

    // Compare paths, after applying path-related options
    QString path1;
    d->appendPath(path1, options, QUrlPrivate::Path);
    QString path2;
    url.d->appendPath(path2, options, QUrlPrivate::Path);
    return path1 == path2;
}